

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::(anonymous_namespace)::MicroStringPrevTest_SelfSetSubstrView_Test::
~MicroStringPrevTest_SelfSetSubstrView_Test(MicroStringPrevTest_SelfSetSubstrView_Test *this)

{
  internal::anon_unknown_0::MicroStringPrevTest_SelfSetSubstrView_Test::
  ~MicroStringPrevTest_SelfSetSubstrView_Test
            ((MicroStringPrevTest_SelfSetSubstrView_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, SelfSetSubstrView) {
  const std::string control(str_.Get());
  if (control.empty()) {
    GTEST_SKIP() << "Can't substr an empty input.";
  }

  const size_t used = arena_space_used();
  const bool will_reuse = str_.Capacity() != 0;
  const size_t self_used = str_.SpaceUsedExcludingSelfLong();

  str_.Set(str_.Get().substr(1), arena());
  EXPECT_EQ(str_.Get(), absl::string_view(control).substr(1));

  if (will_reuse) {
    ExpectMemoryUsed(used, false, self_used);
  }
}